

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O0

void __thiscall
cli::Parser::Parser(Parser *this,int argc,char **argv,string *generalProgramDescriptionForHelpText)

{
  char *pcVar1;
  allocator<char> local_61;
  value_type local_60;
  int local_40;
  int i;
  allocator<char> local_29;
  string *local_28;
  string *generalProgramDescriptionForHelpText_local;
  char **argv_local;
  Parser *pPStack_10;
  int argc_local;
  Parser *this_local;
  
  pcVar1 = *argv;
  local_28 = generalProgramDescriptionForHelpText;
  generalProgramDescriptionForHelpText_local = (string *)argv;
  argv_local._4_4_ = argc;
  pPStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,pcVar1,&local_29);
  std::allocator<char>::~allocator(&local_29);
  std::__cxx11::string::string
            ((string *)&this->_general_help_text,generalProgramDescriptionForHelpText);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->_arguments);
  std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>::vector
            (&this->_commands);
  for (local_40 = 1; local_40 < argv_local._4_4_; local_40 = local_40 + 1) {
    pcVar1 = (&generalProgramDescriptionForHelpText_local->_M_dataplus)[local_40]._M_p;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,pcVar1,&local_61);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->_arguments,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  enable_help(this);
  return;
}

Assistant:

Parser(int argc, char** argv, std::string generalProgramDescriptionForHelpText) :
				_appname(argv[0]),
				_general_help_text(std::move(generalProgramDescriptionForHelpText)) {
			for (int i = 1; i < argc; ++i) {
				_arguments.push_back(argv[i]);
			}
			enable_help();
		}